

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCMPrint.cpp
# Opt level: O2

void processSimpleTypeDefinition(XSSimpleTypeDefinition *xsSimpleTypeDef)

{
  char *in_RAX;
  long *plVar1;
  XMLCh *pXVar2;
  ostream *poVar3;
  char16_t *pcVar4;
  BaseRefVectorOf<char16_t> *pBVar5;
  FACET FVar6;
  uint uVar7;
  uint uVar8;
  StrX local_38;
  
  local_38.fLocalForm = in_RAX;
  plVar1 = (long *)(**(code **)(*(long *)xsSimpleTypeDef + 0x30))();
  std::operator<<((ostream *)&std::cout,"Base:\t\t\t");
  pXVar2 = (XMLCh *)(**(code **)(*plVar1 + 0x10))(plVar1);
  StrX::StrX(&local_38,pXVar2);
  std::operator<<((ostream *)&std::cout,local_38.fLocalForm);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  StrX::~StrX(&local_38);
  uVar8 = *(uint *)(xsSimpleTypeDef + 0x38);
  if (uVar8 != 0) {
    std::operator<<((ostream *)&std::cout,"Facets:\n");
    FVar6 = (FACET)xsSimpleTypeDef;
    if ((uVar8 & 1) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\tLength:\t\t");
      pXVar2 = (XMLCh *)xercesc_4_0::XSSimpleTypeDefinition::getLexicalFacetValue(FVar6);
      StrX::StrX(&local_38,pXVar2);
      std::operator<<(poVar3,local_38.fLocalForm);
      std::endl<char,std::char_traits<char>>(poVar3);
      StrX::~StrX(&local_38);
    }
    if ((uVar8 & 2) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\tMinLength:\t");
      pXVar2 = (XMLCh *)xercesc_4_0::XSSimpleTypeDefinition::getLexicalFacetValue(FVar6);
      StrX::StrX(&local_38,pXVar2);
      std::operator<<(poVar3,local_38.fLocalForm);
      std::endl<char,std::char_traits<char>>(poVar3);
      StrX::~StrX(&local_38);
    }
    if ((uVar8 & 4) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\tMaxLength:\t");
      pXVar2 = (XMLCh *)xercesc_4_0::XSSimpleTypeDefinition::getLexicalFacetValue(FVar6);
      StrX::StrX(&local_38,pXVar2);
      std::operator<<(poVar3,local_38.fLocalForm);
      std::endl<char,std::char_traits<char>>(poVar3);
      StrX::~StrX(&local_38);
    }
    if ((((uVar8 & 8) != 0) &&
        (pBVar5 = *(BaseRefVectorOf<char16_t> **)(xsSimpleTypeDef + 0x60),
        pBVar5 != (BaseRefVectorOf<char16_t> *)0x0)) && (*(long *)(pBVar5 + 0x10) != 0)) {
      std::operator<<((ostream *)&std::cout,"\tPattern:\t\t");
      for (uVar7 = 0; (ulong)uVar7 < *(ulong *)(pBVar5 + 0x10); uVar7 = uVar7 + 1) {
        pcVar4 = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt(pBVar5,(ulong)uVar7);
        StrX::StrX(&local_38,pcVar4);
        std::operator<<((ostream *)&std::cout,local_38.fLocalForm);
        StrX::~StrX(&local_38);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    if ((uVar8 & 0x10) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\tWhitespace:\t\t");
      pXVar2 = (XMLCh *)xercesc_4_0::XSSimpleTypeDefinition::getLexicalFacetValue(FVar6);
      StrX::StrX(&local_38,pXVar2);
      std::operator<<(poVar3,local_38.fLocalForm);
      std::endl<char,std::char_traits<char>>(poVar3);
      StrX::~StrX(&local_38);
    }
    if ((uVar8 & 0x20) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\tMaxInclusive:\t");
      pXVar2 = (XMLCh *)xercesc_4_0::XSSimpleTypeDefinition::getLexicalFacetValue(FVar6);
      StrX::StrX(&local_38,pXVar2);
      std::operator<<(poVar3,local_38.fLocalForm);
      std::endl<char,std::char_traits<char>>(poVar3);
      StrX::~StrX(&local_38);
    }
    if ((uVar8 & 0x40) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\tMaxExclusive:\t");
      pXVar2 = (XMLCh *)xercesc_4_0::XSSimpleTypeDefinition::getLexicalFacetValue(FVar6);
      StrX::StrX(&local_38,pXVar2);
      std::operator<<(poVar3,local_38.fLocalForm);
      std::endl<char,std::char_traits<char>>(poVar3);
      StrX::~StrX(&local_38);
    }
    if ((char)uVar8 < '\0') {
      poVar3 = std::operator<<((ostream *)&std::cout,"\tMinExclusive:\t");
      pXVar2 = (XMLCh *)xercesc_4_0::XSSimpleTypeDefinition::getLexicalFacetValue(FVar6);
      StrX::StrX(&local_38,pXVar2);
      std::operator<<(poVar3,local_38.fLocalForm);
      std::endl<char,std::char_traits<char>>(poVar3);
      StrX::~StrX(&local_38);
    }
    if ((uVar8 >> 8 & 1) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\tMinInclusive:\t");
      pXVar2 = (XMLCh *)xercesc_4_0::XSSimpleTypeDefinition::getLexicalFacetValue(FVar6);
      StrX::StrX(&local_38,pXVar2);
      std::operator<<(poVar3,local_38.fLocalForm);
      std::endl<char,std::char_traits<char>>(poVar3);
      StrX::~StrX(&local_38);
    }
    if ((uVar8 >> 9 & 1) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\tTotalDigits:\t");
      pXVar2 = (XMLCh *)xercesc_4_0::XSSimpleTypeDefinition::getLexicalFacetValue(FVar6);
      StrX::StrX(&local_38,pXVar2);
      std::operator<<(poVar3,local_38.fLocalForm);
      std::endl<char,std::char_traits<char>>(poVar3);
      StrX::~StrX(&local_38);
    }
    if ((uVar8 >> 10 & 1) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\tFractionDigits:\t");
      pXVar2 = (XMLCh *)xercesc_4_0::XSSimpleTypeDefinition::getLexicalFacetValue(FVar6);
      StrX::StrX(&local_38,pXVar2);
      std::operator<<(poVar3,local_38.fLocalForm);
      std::endl<char,std::char_traits<char>>(poVar3);
      StrX::~StrX(&local_38);
    }
    if ((uVar8 >> 0xb & 1) != 0) {
      pBVar5 = (BaseRefVectorOf<char16_t> *)
               xercesc_4_0::XSSimpleTypeDefinition::getLexicalEnumeration();
      if ((pBVar5 != (BaseRefVectorOf<char16_t> *)0x0) && (*(long *)(pBVar5 + 0x10) != 0)) {
        std::operator<<((ostream *)&std::cout,"\tEnumeration:\n");
        for (uVar8 = 0; (ulong)uVar8 < *(ulong *)(pBVar5 + 0x10); uVar8 = uVar8 + 1) {
          poVar3 = std::operator<<((ostream *)&std::cout,"\t\t\t");
          pcVar4 = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt(pBVar5,(ulong)uVar8);
          StrX::StrX(&local_38,pcVar4);
          std::operator<<(poVar3,local_38.fLocalForm);
          std::operator<<(poVar3,"\n");
          StrX::~StrX(&local_38);
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      }
    }
  }
  return;
}

Assistant:

void processSimpleTypeDefinition(XSSimpleTypeDefinition * xsSimpleTypeDef)
{
    XSTypeDefinition *xsBaseTypeDef = xsSimpleTypeDef->getBaseType();
    std::cout << "Base:\t\t\t";
    std::cout << StrX(xsBaseTypeDef->getName()) << std::endl;

    int facets = xsSimpleTypeDef->getDefinedFacets();
    if (facets) {
        std::cout << "Facets:\n";

        if (facets & XSSimpleTypeDefinition::FACET_LENGTH)
                std::cout << "\tLength:\t\t" << StrX(xsSimpleTypeDef->getLexicalFacetValue(XSSimpleTypeDefinition::FACET_LENGTH)) << std::endl;
        if (facets & XSSimpleTypeDefinition::FACET_MINLENGTH)
                std::cout << "\tMinLength:\t" << StrX(xsSimpleTypeDef->getLexicalFacetValue(XSSimpleTypeDefinition::FACET_MINLENGTH)) << std::endl;
        if (facets & XSSimpleTypeDefinition::FACET_MAXLENGTH)
                std::cout << "\tMaxLength:\t" << StrX(xsSimpleTypeDef->getLexicalFacetValue(XSSimpleTypeDefinition::FACET_MAXLENGTH)) << std::endl;
        if (facets & XSSimpleTypeDefinition::FACET_PATTERN) {
            StringList *lexicalPatterns = xsSimpleTypeDef->getLexicalPattern();
            if (lexicalPatterns && lexicalPatterns->size()) {
                std::cout << "\tPattern:\t\t";
                for (unsigned i = 0; i < lexicalPatterns->size(); i++) {
                    std::cout << StrX(lexicalPatterns->elementAt(i));
                }
                std::cout << std::endl;
            }
        }
        if (facets & XSSimpleTypeDefinition::FACET_WHITESPACE)
                std::cout << "\tWhitespace:\t\t" << StrX(xsSimpleTypeDef->getLexicalFacetValue(XSSimpleTypeDefinition::FACET_WHITESPACE)) << std::endl;
        if (facets & XSSimpleTypeDefinition::FACET_MAXINCLUSIVE)
                std::cout << "\tMaxInclusive:\t" << StrX(xsSimpleTypeDef->getLexicalFacetValue(XSSimpleTypeDefinition::FACET_MAXINCLUSIVE)) << std::endl;
        if (facets & XSSimpleTypeDefinition::FACET_MAXEXCLUSIVE)
                std::cout << "\tMaxExclusive:\t" << StrX(xsSimpleTypeDef->getLexicalFacetValue(XSSimpleTypeDefinition::FACET_MAXEXCLUSIVE)) << std::endl;
        if (facets & XSSimpleTypeDefinition::FACET_MINEXCLUSIVE)
                std::cout << "\tMinExclusive:\t" << StrX(xsSimpleTypeDef->getLexicalFacetValue(XSSimpleTypeDefinition::FACET_MINEXCLUSIVE)) << std::endl;
        if (facets & XSSimpleTypeDefinition::FACET_MININCLUSIVE)
                std::cout << "\tMinInclusive:\t" << StrX(xsSimpleTypeDef->getLexicalFacetValue(XSSimpleTypeDefinition::FACET_MININCLUSIVE)) << std::endl;
        if (facets & XSSimpleTypeDefinition::FACET_TOTALDIGITS)
                std::cout << "\tTotalDigits:\t" << StrX(xsSimpleTypeDef->getLexicalFacetValue(XSSimpleTypeDefinition::FACET_TOTALDIGITS)) << std::endl;
        if (facets & XSSimpleTypeDefinition::FACET_FRACTIONDIGITS)
                std::cout << "\tFractionDigits:\t" << StrX(xsSimpleTypeDef->getLexicalFacetValue(XSSimpleTypeDefinition::FACET_FRACTIONDIGITS)) << std::endl;
        if (facets & XSSimpleTypeDefinition::FACET_ENUMERATION) {
            StringList *lexicalEnums = xsSimpleTypeDef->getLexicalEnumeration();
            if (lexicalEnums && lexicalEnums->size()) {
                std::cout << "\tEnumeration:\n";
                for (unsigned i = 0; i < lexicalEnums->size(); i++) {
                    std::cout << "\t\t\t" << StrX(lexicalEnums->elementAt(i)) << "\n";
                }
                std::cout << std::endl;
            }
        }
    }
}